

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SRes SzAr_DecodeFolder(CSzAr *p,UInt32 folderIndex,ILookInStream *inStream,UInt64 startPos,
                      Byte *outBuffer,size_t outSize,ISzAlloc *allocMain)

{
  char cVar1;
  Byte BVar2;
  size_t sVar3;
  UInt64 *pUVar4;
  UInt64 UVar5;
  UInt64 UVar6;
  byte *pbVar7;
  undefined8 uVar8;
  ISzAlloc *pIVar9;
  int __result__;
  SRes SVar10;
  uint uVar11;
  UInt32 UVar12;
  Byte *pBVar13;
  UInt32 *pUVar14;
  ISzAlloc *pIVar15;
  undefined4 *puVar16;
  byte bVar17;
  char cVar18;
  uint uVar19;
  ISzAlloc *pIVar20;
  uint uVar21;
  ulong uVar22;
  ISzAlloc *pIVar23;
  uint uVar24;
  ulong uVar25;
  byte bVar26;
  long lVar27;
  CSzAr *pCVar28;
  ulong uVar29;
  ulong uVar30;
  ISzAlloc *pIVar31;
  uint uVar32;
  UInt64 inSize;
  ISzAlloc *pIVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  int iVar47;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  SizeT inProcessed;
  Byte coderUsed [4];
  CSzFolder folder;
  Byte *tempBuf [3];
  UInt32 numStreams;
  UInt32 numCoders;
  ISzAlloc *local_538;
  ELzmaStatus local_51c;
  ILookInStream *local_518;
  ISzAlloc *local_510;
  ISzAlloc local_508;
  ulong local_4f8;
  CSzData local_4f0;
  ISzAlloc *local_4e0;
  byte *local_4d8;
  CSzAr *local_4d0;
  undefined1 local_4c8 [16];
  UInt64 local_4b8;
  ISzAlloc *local_4a8;
  ISzAlloc *local_4a0;
  ulong local_498;
  UInt32 local_48c;
  undefined8 local_488;
  int iStack_480;
  int iStack_47c;
  Byte *local_478;
  UInt64 local_470;
  int local_468;
  int iStack_464;
  int iStack_460;
  int iStack_45c;
  undefined1 local_458 [16];
  uint local_448 [4];
  UInt32 local_438 [5];
  int local_424;
  ISzAlloc local_420;
  uint local_408;
  char local_404;
  char acStack_403 [11];
  int local_3f8;
  char local_3f4;
  int local_3e8;
  char local_3e4;
  undefined1 local_3d8 [16];
  Byte *local_3c8 [2];
  Byte *local_3b8;
  undefined2 auStack_3b6 [3];
  undefined8 local_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  Byte *local_388 [2];
  ISzAlloc *local_378;
  ISzAlloc *local_370;
  undefined8 local_368;
  Byte *local_360;
  uint local_358 [2];
  Byte local_34d;
  UInt32 UStack_34c;
  UInt32 UStack_348;
  undefined4 local_344;
  undefined2 auStack_340 [2];
  undefined4 local_33c;
  undefined2 auStack_338 [12];
  uint local_320;
  uint local_31c;
  uint local_318;
  byte local_314;
  int local_310 [118];
  undefined8 local_138;
  long lVar36;
  
  local_498 = (ulong)folderIndex;
  sVar3 = p->FoCodersOffsets[local_498];
  pBVar13 = p->CodersData;
  local_4f0.Size = p->FoCodersOffsets[local_498 + 1] - sVar3;
  local_458 = (undefined1  [16])0x0;
  local_518 = inStream;
  local_4f0.Data = pBVar13 + sVar3;
  local_4d0 = p;
  local_48c = folderIndex;
  local_470 = startPos;
  SVar10 = SzReadNumber32(&local_4f0,(UInt32 *)&local_138);
  if (SVar10 != 0) {
    return SVar10;
  }
  uVar11 = (uint)local_138;
  local_538 = (ISzAlloc *)((ulong)local_138 & 0xffffffff);
  if ((uint)local_138 - 5 < 0xfffffffc) {
    return 4;
  }
  uVar30 = 0;
  uVar19 = 0;
  local_4d8 = pBVar13 + sVar3;
  do {
    if (local_4f0.Size == 0) {
      return 0x10;
    }
    local_4f0.Size = local_4f0.Size - 1;
    bVar17 = *local_4f0.Data;
    if (0x3f < bVar17) {
      return 4;
    }
    uVar24 = bVar17 & 0xf;
    if (8 < uVar24) {
      return 4;
    }
    if (local_4f0.Size < uVar24) {
      return 0x10;
    }
    if ((bVar17 & 0xf) == 0) {
      uVar22 = 0;
      local_4f0.Data = local_4f0.Data + 1;
    }
    else {
      lVar27 = 0;
      uVar22 = 0;
      do {
        uVar29 = uVar22 << 8;
        uVar22 = (local_4f0.Data + 1)[lVar27] | uVar29;
        lVar27 = lVar27 + 1;
      } while (uVar24 != (uint)lVar27);
      local_4f0.Size = local_4f0.Size - lVar27;
      local_4f0.Data = local_4f0.Data + (ulong)uVar24 + 1;
      if (uVar29 >> 0x20 != 0) {
        return 4;
      }
    }
    *(int *)&(&local_420)[uVar30].Free = (int)uVar22;
    *(undefined2 *)((long)&(&local_420)[uVar30].Free + 4) = 1;
    (&local_420)[uVar30].Alloc = (_func_void_ptr_void_ptr_size_t *)0x0;
    uVar24 = 1;
    if ((bVar17 & 0x10) != 0) {
      SVar10 = SzReadNumber32(&local_4f0,(UInt32 *)local_3a8);
      if (SVar10 != 0) {
        return SVar10;
      }
      uVar24 = local_3a8._0_4_;
      if (7 < (uint)local_3a8._0_4_) {
        return 4;
      }
      *(char *)((long)&(&local_420)[uVar30].Free + 4) = (char)local_3a8._0_8_;
      SVar10 = SzReadNumber32(&local_4f0,(UInt32 *)local_3a8);
      if (SVar10 != 0) {
        return SVar10;
      }
      if (local_3a8._0_4_ != 1) {
        return 4;
      }
    }
    pbVar7 = local_4d8;
    uVar19 = uVar19 + uVar24;
    if (7 < uVar19) {
      return 4;
    }
    if (0x1f < bVar17) {
      local_3a8._0_8_ = local_3a8._0_8_ & 0xffffffff00000000;
      SVar10 = SzReadNumber32(&local_4f0,(UInt32 *)local_3a8);
      uVar8 = local_3a8._0_8_;
      if (SVar10 != 0) {
        return SVar10;
      }
      uVar22 = local_3a8._0_8_ & 0xffffffff;
      bVar34 = local_4f0.Size < uVar22;
      local_4f0.Size = local_4f0.Size - uVar22;
      if (bVar34) {
        return 0x10;
      }
      if (0x7f < (uint)local_3a8._0_4_) {
        return 4;
      }
      (&local_420)[uVar30].Alloc =
           (_func_void_ptr_void_ptr_size_t *)(local_4f0.Data + -(long)pbVar7);
      *(char *)((long)&(&local_420)[uVar30].Free + 5) = (char)uVar8;
      local_4f0.Data = local_4f0.Data + uVar22;
    }
    auVar42 = local_458;
    uVar30 = uVar30 + 1;
  } while ((ISzAlloc *)uVar30 != local_538);
  uVar32 = uVar11 - 1;
  uVar24 = uVar19 - uVar32;
  if (uVar32 <= uVar19) {
    if (3 < uVar32) {
      return 4;
    }
    local_458._4_4_ = uVar32;
    if (4 < uVar24) {
      return 4;
    }
    local_458._12_4_ = auVar42._12_4_;
    local_458._8_4_ = uVar24;
    if (uVar19 != 0) {
      memset(local_3a8,0,(ulong)uVar19);
    }
    if (uVar32 == 0) {
      uVar30 = 0;
LAB_00110115:
      if (uVar24 == 1) {
        if (uVar19 == 0) {
          uVar22 = 0;
        }
        else {
          uVar22 = 0;
          while (local_3a8[uVar22] != '\0') {
            uVar22 = uVar22 + 1;
            if (uVar19 == uVar22) {
              return 0x10;
            }
          }
        }
        if ((uint)uVar22 == uVar19) {
          return 0x10;
        }
        local_448[0] = (uint)uVar22;
      }
      else if (uVar19 != uVar32) {
        uVar22 = 0;
        do {
          SVar10 = SzReadNumber32(&local_4f0,(UInt32 *)local_4c8);
          if (SVar10 != 0) {
            return SVar10;
          }
          if (uVar19 <= (uint)local_4c8._0_4_) {
            return 0x10;
          }
          if (local_3a8[(uint)local_4c8._0_4_] != '\0') {
            return 0x10;
          }
          local_3a8[(uint)local_4c8._0_4_] = 1;
          local_448[uVar22] = local_4c8._0_4_;
          uVar22 = uVar22 + 1;
        } while (uVar24 + (uVar24 == 0) != uVar22);
      }
      auVar42 = local_458;
      local_458._0_4_ = uVar11;
      auVar35 = local_458;
      if (local_4f0.Size != 0) {
        return 0xb;
      }
      if ((uint)uVar30 != (uint)local_4d0->FoToMainUnpackSizeIndex[local_498]) {
        return 0xb;
      }
      if (local_4d0->CoderUnpackSizes[(uint)uVar30 + local_4d0->FoToCoderUnpackSizes[local_498]] !=
          outSize) {
        return 0xb;
      }
      local_3d8 = (undefined1  [16])0x0;
      local_3c8[0] = (Byte *)0x0;
      uVar19 = local_4d0->FoStartPackStreamIndex[local_498];
      pUVar4 = local_4d0->PackPositions;
      local_4b8 = 0;
      local_4c8 = (undefined1  [16])0x0;
      if ((local_420.Free._4_1_ != '\x01') ||
         (((uVar30 = (ulong)(uint)local_420.Free, (uint)local_420.Free != 0 &&
           ((uint)local_420.Free != 0x30101)) && ((uint)local_420.Free != 0x21))))
      goto LAB_001114c1;
      local_458._4_4_ = auVar42._4_4_;
      local_458._8_4_ = auVar42._8_4_;
      if (uVar11 == 4) {
        if ((((local_404 != '\x01') ||
             ((((local_408 != 0 && (local_408 != 0x30101)) && (local_408 != 0x21)) ||
              (local_3f4 != '\x01')))) ||
            (((local_3f8 != 0 && (local_3f8 != 0x30101)) && (local_3f8 != 0x21)))) ||
           (local_3e8 != 0x303011b)) {
LAB_001114c1:
          local_458 = auVar35;
          uVar11 = 4;
LAB_001114c7:
          lVar27 = 0;
          do {
            (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,local_3c8[lVar27 + -2]);
            lVar27 = lVar27 + 1;
          } while (lVar27 != 3);
          if (uVar11 == 0) {
            pBVar13 = (local_4d0->FolderCRCs).Defs;
            uVar11 = 0;
            if ((pBVar13 != (Byte *)0x0) &&
               ((char)(pBVar13[local_48c >> 3] << ((byte)local_48c & 7)) < '\0')) {
              UVar12 = (*g_CrcUpdate)(0xffffffff,outBuffer,outSize,g_CrcTable);
              uVar11 = (uint)((UVar12 ^ (local_4d0->FolderCRCs).Vals[local_498]) != 0xffffffff) * 3;
            }
          }
          return uVar11;
        }
        auVar39._0_4_ = -(uint)(local_458._4_4_ == 3);
        auVar39._4_4_ = -(uint)(local_438[0] == 5);
        auVar39._8_4_ = -(uint)(local_438[1] == 0);
        auVar39._12_4_ = -(uint)(local_438[2] == 4);
        auVar42._0_4_ = -(uint)(local_448[0] == 2);
        auVar42._4_4_ = -(uint)(local_448[1] == 6);
        auVar42._8_4_ = -(uint)(local_448[2] == 1);
        auVar42._12_4_ = -(uint)(local_448[3] == 0);
        auVar42 = packssdw(auVar42,auVar39);
        auVar42 = packsswb(auVar42,auVar42);
        uVar11 = ~(uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar42[0xf] >> 7) << 0xf);
        uVar30 = (ulong)uVar11;
        if ((((((char)uVar11 != '\0') || (local_458._8_4_ != 4)) || (local_438[3] != 1)) ||
            ((local_438[4] != 3 || (local_424 != 2)))) || (local_3e4 != '\x04')) goto LAB_001114c1;
      }
      else if (uVar11 == 2) {
        if (((local_404 != '\x01') || (local_458._8_4_ != 1)) ||
           ((local_448[0] != 0 ||
            (((local_458._4_4_ != 1 || (local_438[0] != 1)) || (local_438[1] != 0))))))
        goto LAB_001114c1;
        uVar30 = (ulong)local_408;
        if ((int)local_408 < 0x3030401) {
          if (((local_408 != 3) && (local_408 != 0x3030103)) && (local_408 != 0x3030205))
          goto LAB_001114c1;
        }
        else if ((int)local_408 < 0x3030701) {
          if ((local_408 != 0x3030401) && (local_408 != 0x3030501)) goto LAB_001114c1;
        }
        else if ((local_408 != 0x3030701) && (local_408 != 0x3030805)) goto LAB_001114c1;
      }
      else if ((((uVar11 != 1) || (local_458._8_4_ != 1)) || (local_448[0] != 0)) ||
              (local_458._4_4_ != 0)) goto LAB_001114c1;
      local_3b0 = local_4d0->CoderUnpackSizes + local_4d0->FoToCoderUnpackSizes[local_498];
      local_3b8 = outBuffer + outSize;
      local_488 = 0x8000010280000102;
      iStack_480 = -0x7ffffefe;
      iStack_47c = -0x7ffffefe;
      local_468 = -0x80000000;
      iStack_464 = -0x80000000;
      iStack_460 = -0x80000000;
      iStack_45c = -0x80000000;
      local_4f8 = 0;
      local_4a0 = (ISzAlloc *)0x0;
      local_478 = (Byte *)0x0;
      pCVar28 = local_4d0;
      local_458 = auVar35;
LAB_0011032f:
      uVar22 = local_4f8;
      pIVar15 = &local_420;
      pIVar23 = pIVar15 + local_4f8;
      iVar41 = *(int *)&(&local_420)[local_4f8].Free;
      auVar35 = local_458;
      if (0x30100 < iVar41) {
        if (iVar41 != 0x303011b) {
          if (iVar41 == 0x30101) goto LAB_0011042e;
          goto LAB_00110364;
        }
        if (local_4f8 != 3) goto LAB_001114c1;
        UVar5 = pUVar4[(ulong)uVar19 + 1];
        UVar6 = pUVar4[(ulong)uVar19 + 2];
        inSize = UVar6 - UVar5;
        local_4b8 = inSize;
        pBVar13 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,inSize);
        local_3c8[0] = pBVar13;
        if (pBVar13 == (Byte *)0x0 && UVar6 != UVar5) {
LAB_00111571:
          uVar11 = 2;
        }
        else {
          local_3a8._0_8_ = UVar5 + local_470;
          uVar11 = (*local_518->Seek)(local_518,(Int64 *)local_3a8,SZ_SEEK_SET);
          if ((uVar11 == 0) && (uVar11 = SzDecodeCopy(inSize,local_518,pBVar13), uVar11 == 0)) {
            uVar11 = 1;
            if (((local_4c8 & (undefined1  [16])0x3) == (undefined1  [16])0x0) &&
               (((local_4c8 & (undefined1  [16])0x3) == (undefined1  [16])0x0 &&
                ((long)&local_4a0->Alloc + local_4c8._8_8_ + local_4c8._0_8_ == outSize)))) {
              local_3a8._0_8_ = local_478;
              local_388[0] = (Byte *)((long)&local_4a0->Alloc + (long)local_478);
              local_3a8._8_8_ = local_3d8._0_8_;
              local_388[1] = (Byte *)(local_3d8._0_8_ + local_4c8._0_8_);
              local_378 = (ISzAlloc *)(local_4c8._8_8_ + local_3d8._8_8_);
              local_398._8_8_ = pBVar13;
              local_398._0_8_ = local_3d8._8_8_;
              local_370 = (ISzAlloc *)(pBVar13 + inSize);
              local_360 = local_3b8;
              local_358[0] = 9;
              local_358[1] = 0;
              local_34d = '\0';
              UStack_34c = 0;
              UStack_348 = 0;
              lVar27 = 0x39;
              auVar35 = _DAT_0011da90;
              auVar37 = _DAT_0011da80;
              auVar38 = _DAT_0011da70;
              auVar40 = _DAT_0011da60;
              do {
                auVar42 = auVar35 ^ _DAT_0011dab0;
                iVar41 = auVar42._0_4_;
                iVar47 = auVar42._8_4_;
                auVar48._4_4_ = iVar41;
                auVar48._0_4_ = iVar41;
                auVar48._8_4_ = iVar47;
                auVar48._12_4_ = iVar47;
                auVar52._0_4_ = -(uint)(iVar41 < (int)local_488);
                auVar52._4_4_ = -(uint)(iVar41 < local_488._4_4_);
                auVar52._8_4_ = -(uint)(iVar47 < iStack_480);
                auVar52._12_4_ = -(uint)(iVar47 < iStack_47c);
                auVar43._0_4_ = -(uint)(auVar42._4_4_ == local_468);
                auVar43._4_4_ = -(uint)(auVar42._4_4_ == iStack_464);
                auVar43._8_4_ = -(uint)(auVar42._12_4_ == iStack_460);
                auVar43._12_4_ = -(uint)(auVar42._12_4_ == iStack_45c);
                auVar43 = auVar43 & auVar52;
                auVar42 = pshuflw(auVar48,auVar43,0xe8);
                auVar42 = packssdw(auVar42,auVar42);
                if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  auStack_3b6[lVar27] = 0x400;
                }
                auVar42 = packssdw(auVar43,auVar43);
                auVar42 = packssdw(auVar42,auVar42);
                if ((auVar42._0_4_ >> 0x10 & 1) != 0) {
                  auStack_3b6[lVar27 + 1] = 0x400;
                }
                auVar42 = auVar37 ^ _DAT_0011dab0;
                iVar41 = auVar42._0_4_;
                iVar47 = auVar42._8_4_;
                auVar49._4_4_ = iVar41;
                auVar49._0_4_ = iVar41;
                auVar49._8_4_ = iVar47;
                auVar49._12_4_ = iVar47;
                auVar53._0_4_ = -(uint)(iVar41 < (int)local_488);
                auVar53._4_4_ = -(uint)(iVar41 < local_488._4_4_);
                auVar53._8_4_ = -(uint)(iVar47 < iStack_480);
                auVar53._12_4_ = -(uint)(iVar47 < iStack_47c);
                auVar44._0_4_ = -(uint)(auVar42._4_4_ == local_468);
                auVar44._4_4_ = -(uint)(auVar42._4_4_ == iStack_464);
                auVar44._8_4_ = -(uint)(auVar42._12_4_ == iStack_460);
                auVar44._12_4_ = -(uint)(auVar42._12_4_ == iStack_45c);
                auVar44 = auVar44 & auVar53;
                auVar42 = packssdw(auVar49,auVar44);
                auVar42 = packssdw(auVar42,auVar42);
                if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  auStack_3b6[lVar27 + 2] = 0x400;
                }
                auVar42 = pshufhw(auVar44,auVar44,0x84);
                auVar42 = packssdw(auVar42,auVar42);
                if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&local_3b0 + lVar27 * 2) = 0x400;
                }
                auVar42 = auVar38 ^ _DAT_0011dab0;
                iVar41 = auVar42._0_4_;
                iVar47 = auVar42._8_4_;
                auVar50._4_4_ = iVar41;
                auVar50._0_4_ = iVar41;
                auVar50._8_4_ = iVar47;
                auVar50._12_4_ = iVar47;
                auVar54._0_4_ = -(uint)(iVar41 < (int)local_488);
                auVar54._4_4_ = -(uint)(iVar41 < local_488._4_4_);
                auVar54._8_4_ = -(uint)(iVar47 < iStack_480);
                auVar54._12_4_ = -(uint)(iVar47 < iStack_47c);
                auVar45._0_4_ = -(uint)(auVar42._4_4_ == local_468);
                auVar45._4_4_ = -(uint)(auVar42._4_4_ == iStack_464);
                auVar45._8_4_ = -(uint)(auVar42._12_4_ == iStack_460);
                auVar45._12_4_ = -(uint)(auVar42._12_4_ == iStack_45c);
                auVar45 = auVar45 & auVar54;
                auVar42 = pshuflw(auVar50,auVar45,0xe8);
                auVar42 = packssdw(auVar42,auVar42);
                if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&local_3b0 + lVar27 * 2 + 2) = 0x400;
                }
                auVar42 = packssdw(auVar45,auVar45);
                auVar42 = packssdw(auVar42,auVar42);
                if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&local_3b0 + lVar27 * 2 + 4) = 0x400;
                }
                auVar42 = auVar40 ^ _DAT_0011dab0;
                iVar41 = auVar42._0_4_;
                iVar47 = auVar42._8_4_;
                auVar51._4_4_ = iVar41;
                auVar51._0_4_ = iVar41;
                auVar51._8_4_ = iVar47;
                auVar51._12_4_ = iVar47;
                auVar55._0_4_ = -(uint)(iVar41 < (int)local_488);
                auVar55._4_4_ = -(uint)(iVar41 < local_488._4_4_);
                auVar55._8_4_ = -(uint)(iVar47 < iStack_480);
                auVar55._12_4_ = -(uint)(iVar47 < iStack_47c);
                auVar46._0_4_ = -(uint)(auVar42._4_4_ == local_468);
                auVar46._4_4_ = -(uint)(auVar42._4_4_ == iStack_464);
                auVar46._8_4_ = -(uint)(auVar42._12_4_ == iStack_460);
                auVar46._12_4_ = -(uint)(auVar42._12_4_ == iStack_45c);
                auVar46 = auVar46 & auVar55;
                auVar42 = packssdw(auVar51,auVar46);
                auVar42 = packssdw(auVar42,auVar42);
                if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&local_3b0 + lVar27 * 2 + 6) = 0x400;
                }
                auVar42 = pshufhw(auVar46,auVar46,0x84);
                auVar42 = packssdw(auVar42,auVar42);
                if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(local_3a8 + lVar27 * 2) = 0x400;
                }
                lVar36 = auVar35._8_8_;
                auVar35._0_8_ = auVar35._0_8_ + 8;
                auVar35._8_8_ = lVar36 + 8;
                lVar36 = auVar37._8_8_;
                auVar37._0_8_ = auVar37._0_8_ + 8;
                auVar37._8_8_ = lVar36 + 8;
                lVar36 = auVar38._8_8_;
                auVar38._0_8_ = auVar38._0_8_ + 8;
                auVar38._8_8_ = lVar36 + 8;
                lVar36 = auVar40._8_8_;
                auVar40._0_8_ = auVar40._0_8_ + 8;
                auVar40._8_8_ = lVar36 + 8;
                lVar27 = lVar27 + 8;
              } while (lVar27 != 0x141);
              local_368 = outBuffer;
              uVar11 = Bcj2Dec_Decode((CBcj2Dec *)local_3a8);
              if (uVar11 == 0) {
                lVar27 = 4;
                do {
                  uVar11 = 1;
                  if (local_3c8[lVar27] != *(Byte **)(local_3a8 + lVar27 * 8)) goto LAB_001114c7;
                  lVar27 = lVar27 + 1;
                } while (lVar27 != 8);
                if ((UStack_348 == 0) && (local_368 == local_360)) {
                  uVar24 = local_358[0];
joined_r0x00110896:
                  if (uVar24 == 0) goto LAB_00111197;
                }
              }
            }
          }
        }
        goto LAB_001114c7;
      }
      if ((iVar41 == 0) || (iVar41 == 0x21)) {
LAB_0011042e:
        uVar11 = 0;
        bVar34 = (int)local_538 == 4;
        pBVar13 = outBuffer;
        local_538 = (ISzAlloc *)outSize;
        if (bVar34) {
          local_538 = (ISzAlloc *)local_3b0[local_4f8];
          uVar11 = *(uint *)(&DAT_0011dbc4 + local_4f8 * 4);
          if (local_4f8 < 2) {
            pBVar13 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(size_t)local_538);
            if (local_538 != (ISzAlloc *)0x0 && pBVar13 == (Byte *)0x0) goto LAB_00111571;
            uVar24 = (1 - (int)local_4f8) * 8;
            *(Byte **)(local_3d8 + uVar24) = pBVar13;
            *(ISzAlloc **)(local_4c8 + uVar24) = local_538;
            pIVar15 = local_538;
          }
          else {
            if (local_4f8 != 2) goto LAB_001114c1;
            if (outSize < local_538) {
              uVar11 = 5;
              goto LAB_001114c7;
            }
            local_478 = outBuffer + (outSize - (long)local_538);
            pIVar15 = (ISzAlloc *)0x2;
            pBVar13 = local_478;
            local_4a0 = local_538;
          }
        }
        UVar5 = pUVar4[(ulong)uVar19 + (ulong)uVar11];
        UVar6 = pUVar4[(ulong)uVar19 + (ulong)(uVar11 + 1)];
        local_3a8._0_8_ = local_470 + UVar5;
        uVar11 = (*local_518->Seek)(local_518,(Int64 *)local_3a8,SZ_SEEK_SET);
        pIVar33 = local_138;
        if (uVar11 == 0) {
          pIVar31 = (ISzAlloc *)(UVar6 - UVar5);
          iVar41 = *(int *)&(&local_420)[uVar22].Free;
          if (iVar41 == 0x30101) {
            local_398 = (undefined1  [16])0x0;
            uVar11 = LzmaDec_AllocateProbs
                               ((CLzmaDec *)local_3a8,(Byte *)(pIVar23->Alloc + (long)local_4d8),
                                (uint)*(byte *)((long)&(&local_420)[uVar22].Free + 5),pIVar15);
            if (uVar11 == 0) {
              local_398._8_8_ = pBVar13;
              local_370 = local_538;
              local_378 = (ISzAlloc *)0x0;
              UStack_34c = 0;
              UStack_348 = 1;
              local_33c = 0;
              local_368 = (Byte *)0x0;
              local_344 = 1;
              do {
                local_138 = (ISzAlloc *)0x0;
                local_508.Alloc = (_func_void_ptr_void_ptr_size_t *)(ISzAlloc *)0x40000;
                if (pIVar31 < (ISzAlloc *)0x40000) {
                  local_508.Alloc = (_func_void_ptr_void_ptr_size_t *)pIVar31;
                }
                uVar11 = (*local_518->Look)(local_518,(void **)&local_138,(size_t *)&local_508);
                pIVar23 = local_378;
                uVar24 = local_320;
                if (uVar11 != 0) break;
                local_510 = (ISzAlloc *)local_508.Alloc;
                pCVar28 = (CSzAr *)0x1;
                uVar11 = LzmaDec_DecodeToDic((CLzmaDec *)local_3a8,(SizeT)local_538,
                                             (Byte *)local_138,(SizeT *)&local_510,LZMA_FINISH_END,
                                             &local_51c);
                local_508.Alloc =
                     (_func_void_ptr_void_ptr_size_t *)((long)local_508.Alloc - (long)local_510);
                uVar24 = local_320;
                if (uVar11 != 0) break;
                pIVar31 = (ISzAlloc *)((long)pIVar31 - (long)local_510);
                if (local_51c == LZMA_STATUS_FINISHED_WITH_MARK) {
                  bVar34 = local_378 == local_538 && pIVar31 == (ISzAlloc *)0x0;
                  goto LAB_001112d8;
                }
                if (((local_51c == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) &&
                    (local_378 == local_538)) && (pIVar31 == (ISzAlloc *)0x0)) {
                  uVar11 = 0;
                  break;
                }
                if ((local_510 == (ISzAlloc *)0x0) && (pIVar23 == local_378)) goto LAB_001112a8;
                uVar11 = (*local_518->Skip)(local_518,(size_t)local_510);
                uVar24 = local_320;
              } while (uVar11 == 0);
              goto LAB_00111179;
            }
          }
          else {
            auVar35 = local_458;
            if (iVar41 == 0x21) {
              local_398 = (undefined1  [16])0x0;
              if (*(char *)((long)&(&local_420)[uVar22].Free + 5) == '\x01') {
                bVar17 = local_4d8[(long)pIVar23->Alloc];
                if (0x28 < bVar17) goto LAB_001114c1;
                uVar11 = 0xffffffff;
                if (bVar17 != 0x28) {
                  uVar11 = (bVar17 & 1 | 2) << ((bVar17 >> 1) + 0xb & 0x1f);
                }
                local_138._0_4_ =
                     CONCAT13((char)(uVar11 >> 0x10),
                              CONCAT12((char)(uVar11 >> 8),CONCAT11((char)uVar11,4)));
                local_138._5_3_ = SUB83(pIVar33,5);
                local_138._0_5_ = CONCAT14((char)(uVar11 >> 0x18),(uint)local_138);
                uVar11 = LzmaDec_AllocateProbs
                                   ((CLzmaDec *)local_3a8,(Byte *)&local_138,5,
                                    (ISzAlloc *)(ulong)(uVar11 >> 0x10));
                if (uVar11 == 0) {
                  local_398._8_8_ = pBVar13;
                  local_370 = local_538;
                  local_318 = 0;
                  local_310._0_8_ = 0x100000001;
                  local_310[2] = 1;
                  local_378 = (ISzAlloc *)0x0;
                  UStack_34c = 0;
                  UStack_348 = 1;
                  local_33c = 0;
                  local_368 = (Byte *)0x0;
                  local_344 = 1;
LAB_00110a5f:
                  local_508.Alloc = (_func_void_ptr_void_ptr_size_t *)0x0;
                  local_510 = (ISzAlloc *)0x40000;
                  if (pIVar31 < (ISzAlloc *)0x40000) {
                    local_510 = pIVar31;
                  }
                  pIVar23 = &local_508;
                  uVar11 = (*local_518->Look)(local_518,&pIVar23->Alloc,(size_t *)&local_510);
                  uVar24 = local_320;
                  if (uVar11 == 0) {
                    local_508.Free = (_func_void_void_ptr_void_ptr *)local_510;
                    local_4a8 = local_378;
                    local_4e0 = (ISzAlloc *)local_508.Alloc;
                    local_51c = LZMA_STATUS_NOT_SPECIFIED;
                    pIVar15 = local_378;
                    if (local_318 != 8) {
                      pIVar33 = (ISzAlloc *)0x0;
                      do {
                        uVar8 = local_3a8._8_8_;
                        uVar32 = 1;
                        uVar11 = uVar32;
                        uVar24 = local_320;
                        if (local_318 == 9) goto LAB_00111179;
                        if ((local_318 & 0xfffffffe) == 6) {
                          local_138 = (ISzAlloc *)((long)local_508.Free - (long)pIVar33);
                          pCVar28 = (CSzAr *)0x0;
                          bVar34 = (ISzAlloc *)(ulong)local_31c <=
                                   (ISzAlloc *)((long)local_538 - (long)pIVar15);
                          pIVar23 = (ISzAlloc *)((long)local_538 - (long)pIVar15);
                          if (bVar34) {
                            pIVar23 = (ISzAlloc *)(ulong)local_31c;
                          }
                          if ((char)local_314 < '\0') {
                            if (local_318 == 6) {
                              bVar17 = local_314 >> 5 & 3;
                              if (bVar17 == 3) {
                                local_33c = 0;
                                local_368 = (Byte *)((ulong)local_368 & 0xffffffff00000000);
                                puVar16 = (undefined4 *)((long)&local_368 + 4);
LAB_00110e4a:
                                UStack_348 = 1;
                                UStack_34c = 0;
                                *puVar16 = 0;
                                local_344 = 1;
LAB_00110e5b:
                                local_310._0_8_ = 0;
                                local_318 = 7;
                                goto LAB_00110e72;
                              }
                              if (local_310[0] == 0) {
                                if (bVar17 != 0) {
                                  puVar16 = &local_33c;
                                  goto LAB_00110e4a;
                                }
                                pCVar28 = (CSzAr *)0x0;
                                if (local_310[1] != 0) goto LAB_0011129d;
                                UStack_34c = 0;
                                UStack_348 = 1;
                                local_33c = 0;
                                goto LAB_00110e5b;
                              }
LAB_0011129d:
                              local_320 = uVar24;
                              local_318 = 9;
                              goto LAB_001112a8;
                            }
LAB_00110e72:
                            if ((ISzAlloc *)(ulong)local_320 < local_138) {
                              local_138 = (ISzAlloc *)(ulong)local_320;
                            }
                            pCVar28 = (CSzAr *)(ulong)bVar34;
                            uVar11 = LzmaDec_DecodeToDic((CLzmaDec *)local_3a8,
                                                         (long)&pIVar23->Alloc + (long)pIVar15,
                                                         (Byte *)local_4e0,&local_138,(uint)bVar34,
                                                         &local_51c);
                            pIVar23 = (ISzAlloc *)(ulong)local_320;
                            uVar24 = local_320 - (uint)local_138;
                            local_31c = ((int)pIVar15 - (int)local_378) + local_31c;
                            if (uVar11 != 0) goto LAB_00111179;
                            pIVar33 = (ISzAlloc *)((long)&pIVar33->Alloc + (long)local_138);
                            pIVar20 = local_378;
                            pIVar9 = pIVar33;
                            if (local_51c == LZMA_STATUS_NEEDS_MORE_INPUT) goto LAB_00110fd6;
                            local_4e0 = (ISzAlloc *)((long)&local_4e0->Alloc + (long)local_138);
                            if ((local_138 == (ISzAlloc *)0x0) && (pIVar15 == local_378)) {
                              if (((local_51c != LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) ||
                                  (local_31c != 0)) || (local_320 != (uint)local_138))
                              goto LAB_0011129d;
                              local_318 = 0;
                            }
                            else {
                              pIVar15 = local_378;
                              local_320 = uVar24;
                              if (local_51c != LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK)
                              goto LAB_00110f7b;
                            }
                            local_51c = LZMA_STATUS_NOT_FINISHED;
                            pIVar15 = local_378;
                            local_320 = uVar24;
                          }
                          else {
                            pIVar20 = pIVar15;
                            pIVar9 = (ISzAlloc *)local_508.Free;
                            if ((ISzAlloc *)local_508.Free == pIVar33) goto LAB_00110fd6;
                            if (local_318 == 6) {
                              if (local_314 == 1) {
                                local_310[2] = 1;
                                local_310._0_8_ = 0x100000000;
                                UStack_34c = 0;
                                UStack_348 = 1;
                                local_33c = 0;
                                local_368 = (Byte *)0x0;
                                local_344 = 1;
                              }
                              else {
                                if (local_310[0] != 0) goto LAB_0011129d;
                                UStack_34c = 0;
                                UStack_348 = 1;
                                local_33c = 0;
                              }
                            }
                            pIVar20 = local_138;
                            if (pIVar23 < local_138) {
                              pIVar20 = pIVar23;
                            }
                            local_138 = pIVar20;
                            if (pIVar20 == (ISzAlloc *)0x0) goto LAB_0011129d;
                            pIVar23 = local_4e0;
                            memcpy((Byte *)((long)&pIVar15->Alloc + local_398._8_8_),local_4e0,
                                   (size_t)pIVar20);
                            pIVar15 = (ISzAlloc *)((long)&local_378->Alloc + (long)pIVar20);
                            UVar12 = (UInt32)local_368;
                            if (local_368._4_4_ == 0) {
                              pIVar23 = (ISzAlloc *)(ulong)(local_3a8._12_4_ - (UInt32)local_368);
                              if (pIVar23 <= pIVar20) {
                                local_368 = (Byte *)((ulong)(uint)local_3a8._12_4_ << 0x20);
                              }
                            }
                            local_368 = (Byte *)CONCAT44(local_368._4_4_,UVar12 + (int)pIVar20);
                            local_4e0 = (ISzAlloc *)((long)&local_4e0->Alloc + (long)pIVar20);
                            pIVar33 = (ISzAlloc *)((long)&pIVar33->Alloc + (long)pIVar20);
                            local_31c = local_31c - (int)pIVar20;
                            local_318 = 7;
                            local_378 = pIVar15;
                            if (local_31c == 0) {
                              local_318 = 0;
                            }
                          }
                        }
                        else {
                          if ((ISzAlloc *)local_508.Free == pIVar33) {
                            local_510 = (ISzAlloc *)((long)local_510 - (long)local_508.Free);
                            goto LAB_00110fde;
                          }
                          pIVar33 = (ISzAlloc *)((long)&pIVar33->Alloc + 1);
                          uVar24 = 9;
                          if (local_318 < 6) {
                            bVar17 = *(byte *)&local_4e0->Alloc;
                            pIVar23 = (ISzAlloc *)CONCAT71((int7)((ulong)pIVar23 >> 8),bVar17);
                            uVar32 = (uint)bVar17;
                            switch(local_318) {
                            case 0:
                              local_314 = bVar17;
                              if (bVar17 == 0) {
                                local_318 = 8;
                                goto LAB_001112cb;
                              }
                              if ((char)bVar17 < '\0') {
                                local_31c = (uVar32 & 0x1f) << 0x10;
                              }
                              else {
                                if (2 < bVar17) break;
                                local_31c = 0;
                              }
                              uVar24 = 1;
                              break;
                            case 1:
                              local_31c = local_31c | uVar32 << 8;
                              uVar24 = 2;
                              break;
                            case 2:
                              local_31c = (uVar32 | local_31c) + 1;
                              uVar24 = (uint)(-1 < (char)local_314) * 3 + 3;
                              break;
                            case 3:
                              local_320 = uVar32 << 8;
                              uVar24 = 4;
                              break;
                            case 4:
                              local_320 = (uVar32 | local_320) + 1;
                              uVar24 = 5;
                              if ((local_314 & 0x40) == 0) {
                                uVar24 = (uint)(local_310[2] != 0) * 3 + 6;
                              }
                              break;
                            case 5:
                              if (bVar17 < 0xe1) {
                                cVar1 = (char)(uVar32 / 9);
                                bVar26 = (char)((ulong)pIVar23 & 0xffffffff) + cVar1 * -9;
                                pCVar28 = (CSzAr *)CONCAT71((int7)(((ulong)pIVar23 & 0xffffffff) >>
                                                                  8),bVar26);
                                cVar18 = (char)(uVar32 * 0x6d >> 8);
                                local_3a8._9_3_ = 0;
                                local_3a8[8] = (byte)(((byte)(bVar17 - cVar18) >> 1) + cVar18) >> 5;
                                local_3a8._12_4_ = SUB84(uVar8,4);
                                bVar17 = cVar1 + (char)((uVar32 / 9) * 0x34 >> 8) * -5;
                                uVar32 = CONCAT31(0,bVar26);
                                uVar21 = bVar17 + uVar32;
                                pIVar23 = (ISzAlloc *)(ulong)uVar21;
                                if (uVar21 < 5) {
                                  local_3a8[4] = bVar17;
                                  local_3a8._0_4_ = uVar32;
                                  local_3a8._5_3_ = 0;
                                  local_310[2] = 0;
                                  uVar24 = 6;
                                }
                              }
                            }
                          }
                          if (local_538 == pIVar15) {
                            local_318 = 9;
                            uVar24 = local_320;
                            goto LAB_00111179;
                          }
                          local_4e0 = (ISzAlloc *)((long)&local_4e0->Alloc + 1);
                          local_318 = uVar24;
                        }
LAB_00110f7b:
                        if (local_318 == 8) goto LAB_001112cb;
                      } while( true );
                    }
                    pIVar33 = (ISzAlloc *)0x0;
LAB_001112cb:
                    bVar34 = pIVar31 == pIVar33 && pIVar15 == local_538;
LAB_001112d8:
                    uVar11 = (uint)!bVar34;
                    uVar24 = local_320;
                  }
                  goto LAB_00111179;
                }
                goto LAB_001114c7;
              }
            }
            else {
              if (iVar41 != 0) goto LAB_001114c1;
              if (pIVar31 == local_538) {
                uVar11 = SzDecodeCopy((UInt64)local_538,local_518,pBVar13);
                uVar24 = uVar11;
                goto joined_r0x00110896;
              }
            }
            uVar11 = 1;
          }
        }
        goto LAB_001114c7;
      }
LAB_00110364:
      if (local_4f8 != 1) goto LAB_001114c1;
      cVar1 = acStack_403[0];
      pUVar14 = (UInt32 *)CONCAT71((int7)((ulong)pIVar15 >> 8),cVar1);
      if (iVar41 == 3) {
        if (cVar1 != '\x01') goto LAB_001114c1;
        memset(&local_138,0,0x100);
        bVar17 = local_4d8[(long)pIVar23->Alloc];
        memcpy(local_3a8,&local_138,(ulong)bVar17 + 1);
        if (outSize != 0) {
          uVar30 = 0;
          uVar22 = 0;
          do {
            BVar2 = outBuffer[uVar22];
            cVar1 = local_3a8[uVar30];
            uVar29 = uVar22 + 1;
            uVar25 = uVar30 + 1;
            if (outSize <= uVar29) {
              uVar25 = 0;
            }
            outBuffer[uVar22] = BVar2 + cVar1;
            if (bVar17 <= uVar30) {
              uVar25 = 0;
            }
            local_3a8[uVar30] = BVar2 + cVar1;
            uVar30 = uVar25;
            uVar22 = uVar29;
            pCVar28 = (CSzAr *)outSize;
          } while (uVar29 < outSize);
        }
      }
      else {
        if (cVar1 != '\0') goto LAB_001114c1;
        iVar47 = (int)pUVar14;
        UVar12 = (UInt32)uVar30;
        if (iVar41 < 0x3030501) {
          if (iVar41 == 0x3030103) {
            local_3a8._0_8_ = local_3a8._0_8_ & 0xffffffff00000000;
            x86_Convert(outBuffer,outSize,(UInt32)local_3a8,pUVar14,(int)pCVar28);
          }
          else {
            if (iVar41 != 0x3030205) {
              if (iVar41 == 0x3030401) {
                IA64_Convert(outBuffer,outSize,UVar12,iVar47);
                goto LAB_00111197;
              }
              goto LAB_001114c1;
            }
            PPC_Convert(outBuffer,outSize,UVar12,iVar47);
          }
        }
        else if (iVar41 == 0x3030501) {
          ARM_Convert(outBuffer,outSize,UVar12,iVar47);
        }
        else if (iVar41 == 0x3030701) {
          ARMT_Convert(outBuffer,outSize,UVar12,iVar47);
        }
        else {
          if (iVar41 != 0x3030805) goto LAB_001114c1;
          SPARC_Convert(outBuffer,outSize,UVar12,iVar47);
        }
      }
      goto LAB_00111197;
    }
    local_488 = (ulong)uVar24;
    memset(local_4c8,0,(size_t)local_538);
    uVar30 = (ulong)uVar32;
    pUVar14 = local_438 + 1;
    do {
      SVar10 = SzReadNumber32(&local_4f0,pUVar14 + -1);
      if (SVar10 != 0) {
        return SVar10;
      }
      uVar24 = pUVar14[-1];
      if (uVar19 <= uVar24) {
        return 0x10;
      }
      if (local_3a8[uVar24] != '\0') {
        return 0x10;
      }
      local_3a8[uVar24] = 1;
      SVar10 = SzReadNumber32(&local_4f0,pUVar14);
      if (SVar10 != 0) {
        return SVar10;
      }
      uVar24 = *pUVar14;
      if (uVar11 <= uVar24) {
        return 0x10;
      }
      cVar1 = local_4c8[uVar24];
      local_4c8[uVar24] = cVar1 + (cVar1 == '\0');
      if (cVar1 != '\0') {
        return 0x10;
      }
      pUVar14 = pUVar14 + 2;
      uVar30 = uVar30 - 1;
    } while (uVar30 != 0);
    uVar30 = 0;
    do {
      if (local_4c8[uVar30] == '\0') {
        local_458._12_4_ = (uint)uVar30;
        uVar24 = (uint)local_488;
        if (uVar11 == (uint)uVar30) {
          return 0x10;
        }
        goto LAB_00110115;
      }
      uVar30 = uVar30 + 1;
    } while (local_538 != (ISzAlloc *)uVar30);
  }
  return 0x10;
LAB_00110fd6:
  local_320 = uVar24;
  local_508.Free = (_func_void_void_ptr_void_ptr *)pIVar9;
  local_510 = (ISzAlloc *)((long)local_510 - (long)local_508.Free);
  pIVar15 = pIVar20;
LAB_00110fde:
  if ((((ISzAlloc *)local_508.Free == (ISzAlloc *)0x0) &&
      (uVar11 = uVar32, uVar24 = local_320, local_4a8 == pIVar15)) ||
     (uVar11 = (*local_518->Skip)(local_518,(size_t)local_508.Free), uVar24 = local_320, uVar11 != 0
     )) goto LAB_00111179;
  pIVar31 = (ISzAlloc *)((long)pIVar31 - (long)local_508.Free);
  goto LAB_00110a5f;
LAB_001112a8:
  uVar11 = 1;
  uVar24 = local_320;
LAB_00111179:
  local_320 = uVar24;
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(void *)local_398._0_8_);
  if (uVar11 != 0) goto LAB_001114c7;
LAB_00111197:
  local_4f8 = local_4f8 + 1;
  uVar30 = (ulong)(uint)local_458._0_4_;
  uVar11 = 0;
  local_538 = (ISzAlloc *)uVar30;
  if (uVar30 <= local_4f8) goto LAB_001114c7;
  goto LAB_0011032f;
}

Assistant:

static SRes SzAr_DecodeFolder(const CSzAr *p, UInt32 folderIndex,
    ILookInStream *inStream, UInt64 startPos,
    Byte *outBuffer, size_t outSize,
    ISzAlloc *allocMain)
{
  SRes res;
  CSzFolder folder;
  CSzData sd;
  
  const Byte *data = p->CodersData + p->FoCodersOffsets[folderIndex];
  sd.Data = data;
  sd.Size = p->FoCodersOffsets[folderIndex + 1] - p->FoCodersOffsets[folderIndex];
  
  res = SzGetNextFolderItem(&folder, &sd);
  
  if (res != SZ_OK)
    return res;

  if (sd.Size != 0
      || folder.UnpackStream != p->FoToMainUnpackSizeIndex[folderIndex]
      || outSize != SzAr_GetFolderUnpackSize(p, folderIndex))
    return SZ_ERROR_FAIL;
  {
    unsigned i;
    Byte *tempBuf[3] = { 0, 0, 0};

    res = SzFolder_Decode2(&folder, data,
        &p->CoderUnpackSizes[p->FoToCoderUnpackSizes[folderIndex]],
        p->PackPositions + p->FoStartPackStreamIndex[folderIndex],
        inStream, startPos,
        outBuffer, (SizeT)outSize, allocMain, tempBuf);
    
    for (i = 0; i < 3; i++)
      IAlloc_Free(allocMain, tempBuf[i]);

    if (res == SZ_OK)
      if (SzBitWithVals_Check(&p->FolderCRCs, folderIndex))
        if (CrcCalc(outBuffer, outSize) != p->FolderCRCs.Vals[folderIndex])
          res = SZ_ERROR_CRC;

    return res;
  }
}